

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O1

void __thiscall xmrig::Miner::setJob(Miner *this,Job *job)

{
  pointer ppIVar1;
  MinerPrivate *pMVar2;
  bool bVar3;
  int iVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  pointer ppIVar5;
  
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar5 = (this->d_ptr->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
    (*(*ppIVar5)->_vptr_IBackend[7])(*ppIVar5,job);
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  bVar3 = true;
  src = extraout_RDX;
  if ((this->d_ptr->job).m_index == '\x01') {
    bVar3 = String::isEqual(&this->d_ptr->userJobId,&job->m_id);
    bVar3 = !bVar3;
    src = extraout_RDX_00;
  }
  pMVar2 = this->d_ptr;
  pMVar2->reset = bVar3;
  Job::copy(&pMVar2->job,(EVP_PKEY_CTX *)job,src);
  pMVar2 = this->d_ptr;
  (pMVar2->job).m_index = '\0';
  String::copy(&pMVar2->userJobId,(EVP_PKEY_CTX *)&job->m_id,src_00);
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  pMVar2 = this->d_ptr;
  pMVar2->active = true;
  if (pMVar2->reset == true) {
    Nonce::reset((pMVar2->job).m_index);
  }
  ppIVar5 = (pMVar2->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (pMVar2->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar5 != ppIVar1) {
    do {
      (*(*ppIVar5)->_vptr_IBackend[9])(*ppIVar5,&pMVar2->job);
      ppIVar5 = ppIVar5 + 1;
    } while (ppIVar5 != ppIVar1);
  }
  Nonce::touch();
  if (pMVar2->enabled != false) {
    LOCK();
    Nonce::m_paused = 0;
    UNLOCK();
  }
  if (pMVar2->ticks != 0) {
    return;
  }
  pMVar2->ticks = 1;
  Timer::start(pMVar2->timer,500,500);
  return;
}

Assistant:

void xmrig::Miner::setJob(const Job &job)
{
    for (IBackend *backend : d_ptr->backends) {
        backend->prepare(job);
    }

    mutex.lock();

    const uint8_t index = 0;

    d_ptr->reset = !(d_ptr->job.index() == 1 && index == 0 && d_ptr->userJobId == job.id());
    d_ptr->job   = job;
    d_ptr->job.setIndex(index);

    if (index == 0) {
        d_ptr->userJobId = job.id();
    }

    mutex.unlock();
    d_ptr->handleJobChange();
}